

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void determine_system_keymap(void)

{
  int iVar1;
  char cVar2;
  uint uVar3;
  istream *piVar4;
  long lVar5;
  size_t sVar6;
  long *plVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  int utf8code;
  string line;
  stringstream ss;
  stringstream dump;
  wchar_t local_39c;
  string local_398;
  long local_378;
  ulong local_370;
  ulong local_368;
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  long local_340 [2];
  ostream local_330 [8];
  string local_328 [104];
  ios_base aiStack_2c0 [264];
  long local_1b8 [16];
  ios_base aiStack_138 [264];
  
  memset(char_keys,0,0xc4);
  memset(shift_keys,0,0xc4);
  memset(altgr_keys,0,0xc4);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  execute_abi_cxx11_(&local_398,
                     "/usr/bin/dumpkeys -n | /bin/grep \'^\\([[:space:]]shift[[:space:]]\\)*\\([[:space:]]altgr[[:space:]]\\)*keycode\'"
                    );
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_1b8,(string *)&local_398,_S_out|_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  local_398._M_string_length = 0;
  local_398.field_2._M_local_buf[0] = '\0';
  local_370 = 0;
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
LAB_001064a8:
  do {
    iVar1 = (int)local_370;
    uVar10 = iVar1 - 7;
    if (10 < iVar1 - 0x2bU) {
      uVar10 = -(uint)(local_370 != 0x56) | 0x2f;
    }
    uVar3 = iVar1 - 6;
    if (0xb < iVar1 - 0x1eU) {
      uVar3 = uVar10;
    }
    uVar10 = iVar1 - 4;
    if (0xb < iVar1 - 0x10U) {
      uVar10 = uVar3;
    }
    uVar3 = (uint)(local_370 - 2);
    if (0xb < local_370 - 2) {
      uVar3 = uVar10;
    }
    local_378 = (long)(int)uVar3;
    uVar8 = local_370 + 1;
    local_368 = local_370;
LAB_0010650b:
    local_370 = uVar8;
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_1b8[0] + -0x18) + (char)(istream *)local_1b8
                           );
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,(string *)&local_398,cVar2);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
LAB_00106892:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(aiStack_138);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
      std::ios_base::~ios_base(aiStack_2c0);
      return;
    }
    std::ios::clear((int)*(undefined8 *)(local_340[0] + -0x18) + (int)local_340);
    local_360[0] = local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"");
    std::__cxx11::stringbuf::str(local_328);
    if (local_360[0] != local_350) {
      operator_delete(local_360[0]);
    }
    local_39c = L'\0';
    uVar8 = 0;
    while( true ) {
      lVar5 = std::__cxx11::string::find((char *)&local_398,0x10969b,uVar8);
      lVar5 = lVar5 << 0x20;
      if (lVar5 == -0x100000000) break;
      uVar8 = lVar5 >> 0x20;
      local_398._M_dataplus._M_p[uVar8] = '0';
      local_398._M_dataplus._M_p[lVar5 + 0x100000000 >> 0x20] = 'x';
    }
    if (0x7f < local_368) goto LAB_00106892;
    if ("_fccccccccccccffccccccccccccffccccccccccccfcccccccccccffffffffffffffffffffffffffffff__cff_______ffffffffffffffff_______f_____fff"
        [local_370] != 'c') goto LAB_001064a8;
    if (local_398._M_string_length == 0) {
      __assert_fail("line.size() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/regular-dev[P]MousKee/src/main.cpp"
                    ,0xbb,"void determine_system_keymap()");
    }
    if (*local_398._M_dataplus._M_p != 'k') {
      pcVar9 = local_398._M_dataplus._M_p + 0x15;
      sVar6 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(local_330,pcVar9,sVar6);
      *(uint *)(local_328 + *(long *)(local_340[0] + -0x18)) =
           *(uint *)(local_328 + *(long *)(local_340[0] + -0x18)) & 0xffffffb5 | 8;
      std::istream::operator>>((istream *)local_340,&local_39c);
      if ((local_398._M_dataplus._M_p[0x15] == '+') && ((local_39c & 0xb00U) != 0)) {
        local_39c = local_39c ^ 0xb00;
      }
      if (local_398._M_dataplus._M_p[1] == 's') {
        shift_keys[local_378] = local_39c;
      }
      uVar8 = local_370;
      if (local_398._M_dataplus._M_p[1] == 'a') {
        altgr_keys[local_378] = local_39c;
      }
      goto LAB_0010650b;
    }
    iVar1 = (int)local_368;
    if (iVar1 - 1U < 0xc) {
      uVar10 = iVar1 - 1;
    }
    else if (iVar1 - 0xfU < 0xc) {
      uVar10 = iVar1 - 3;
    }
    else if (iVar1 - 0x1dU < 0xc) {
      uVar10 = iVar1 - 5;
    }
    else if (iVar1 - 0x2aU < 0xb) {
      uVar10 = iVar1 - 6;
    }
    else {
      uVar10 = -(uint)(local_370 != 0x56) | 0x2f;
    }
    pcVar9 = local_398._M_dataplus._M_p + 0xe;
    sVar6 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>(local_330,pcVar9,sVar6);
    *(uint *)(local_328 + *(long *)(local_340[0] + -0x18)) =
         *(uint *)(local_328 + *(long *)(local_340[0] + -0x18)) & 0xffffffb5 | 8;
    std::istream::operator>>((istream *)local_340,&local_39c);
    if ((local_398._M_dataplus._M_p[0xe] == '+') && ((local_39c & 0xb00U) != 0)) {
      local_39c = local_39c ^ 0xb00;
    }
    char_keys[(int)uVar10] = local_39c;
    *(uint *)(local_328 + *(long *)(local_340[0] + -0x18)) =
         *(uint *)(local_328 + *(long *)(local_340[0] + -0x18)) & 0xffffffb5 | 8;
    plVar7 = (long *)std::istream::operator>>((istream *)local_340,&local_39c);
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
      if ((local_398._M_dataplus._M_p[0xe] == '+') && ((local_39c & 0xb00U) != 0)) {
        local_39c = local_39c ^ 0xb00;
      }
      shift_keys[(int)uVar10] = local_39c;
    }
    *(uint *)(local_328 + *(long *)(local_340[0] + -0x18)) =
         *(uint *)(local_328 + *(long *)(local_340[0] + -0x18)) & 0xffffffb5 | 8;
    plVar7 = (long *)std::istream::operator>>((istream *)local_340,&local_39c);
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
      if ((local_398._M_dataplus._M_p[0xe] == '+') && ((local_39c & 0xb00U) != 0)) {
        local_39c = local_39c ^ 0xb00;
      }
      altgr_keys[(int)uVar10] = local_39c;
    }
  } while( true );
}

Assistant:

void determine_system_keymap()
{
    // custom map will be used; erase existing US keymapping
    memset(char_keys,  '\0', sizeof(char_keys));
    memset(shift_keys, '\0', sizeof(shift_keys));
    memset(altgr_keys, '\0', sizeof(altgr_keys));

    // get keymap from dumpkeys
    // if one knows of a better, more portable way to get wchar_t-s from symbolic keysym-s from `dumpkeys` or `xmodmap` or another, PLEASE LET ME KNOW! kthx
    std::stringstream ss, dump(execute(COMMAND_STR_DUMPKEYS));             // see example output after i.e. `loadkeys slovene`
    std::string line;

    unsigned int i = 0;             // keycode
    int index;
    int utf8code;             // utf-8 code of keysym answering keycode i

    while (std::getline(dump, line)) {
        ss.clear();
        ss.str("");
        utf8code = 0;

        // replace any U+#### with 0x#### for easier parsing
        index = line.find("U+", 0);
        while (static_cast<std::string::size_type>(index) != std::string::npos) {
            line[index] = '0'; line[index + 1] = 'x';
            index = line.find("U+", index);
        }

        if (++i >= sizeof(char_or_func)) break;                         // only ever map keycodes up to 128 (currently N_KEYS_DEFINED are used)
        if (!is_char_key(i)) continue;                         // only map character keys of keyboard

        assert(line.size() > 0);
        if (line[0] == 'k') {                         // if line starts with 'keycode'
            index = to_char_keys_index(i);

            ss << &line[14];                                     // 1st keysym starts at index 14 (skip "keycode XXX = ")
            ss >> std::hex >> utf8code;
            // 0XB00CLUELESS: 0xB00 is added to some keysyms that are preceeded with '+'; I don't really know why; see `man keymaps`; `man loadkeys` says numeric keysym values aren't to be relied on, orly?
            if (line[14] == '+' && (utf8code & 0xB00)) utf8code ^= 0xB00;
            char_keys[index] = static_cast<wchar_t>(utf8code);

            // if there is a second keysym column, assume it is a shift column
            if (ss >> std::hex >> utf8code) {
                if (line[14] == '+' && (utf8code & 0xB00)) utf8code ^= 0xB00;
                shift_keys[index] = static_cast<wchar_t>(utf8code);
            }

            // if there is a third keysym column, assume it is an altgr column
            if (ss >> std::hex >> utf8code) {
                if (line[14] == '+' && (utf8code & 0xB00)) utf8code ^= 0xB00;
                altgr_keys[index] = static_cast<wchar_t>(utf8code);
            }

            continue;
        }

        // else if line starts with 'shift i'
        index = to_char_keys_index(--i);
        ss << &line[21];                         // 1st keysym starts at index 21 (skip "\tshift\tkeycode XXX = " or "\taltgr\tkeycode XXX = ")
        ss >> std::hex >> utf8code;
        if (line[21] == '+' && (utf8code & 0xB00)) utf8code ^= 0xB00;                         // see line 0XB00CLUELESS

        if (line[1] == 's')                         // if line starts with "shift"
            shift_keys[index] = static_cast<wchar_t>(utf8code);
        if (line[1] == 'a')                         // if line starts with "altgr"
            altgr_keys[index] = static_cast<wchar_t>(utf8code);
    }             // while (getline(dump, line))
}